

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxout.cpp
# Opt level: O0

void __thiscall
AbstractTxOut_ConstractorGetterSetter_Test::~AbstractTxOut_ConstractorGetterSetter_Test
          (AbstractTxOut_ConstractorGetterSetter_Test *this)

{
  AbstractTxOut_ConstractorGetterSetter_Test *this_local;
  
  ~AbstractTxOut_ConstractorGetterSetter_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTxOut, ConstractorGetterSetter) {
  {
    AbstractTxOut actual = AbstractTxOut(expect_value, expect_locking_script);
    EXPECT_EQ(expect_value, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut(expect_locking_script);
    EXPECT_EQ(0, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    EXPECT_EQ(Amount::CreateBySatoshiAmount(0), actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    Amount amt = Amount::CreateBySatoshiAmount(int64_t{10});
    actual.SetValue(amt);
    EXPECT_EQ(amt, actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }
}